

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_service.cpp
# Opt level: O3

bool __thiscall
booster::aio::event_loop_impl::run_one(event_loop_impl *this,event *evs,size_t evs_size)

{
  _Head_base<0UL,_booster::aio::reactor_*,_false> this_00;
  _Map_pointer ppcVar1;
  _Elt_pointer pcVar2;
  const_iterator __position;
  _Base_ptr p_Var3;
  pollfd pVar4;
  error_category *peVar5;
  error_category *peVar6;
  int iVar7;
  native_type nVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  callable<void_(const_std::error_code_&)> *r;
  event *this_01;
  size_t sVar12;
  pollfd *ppVar13;
  io_data *piVar14;
  system_error *this_02;
  fd_set *in_RCX;
  pthread_mutex_t *ppVar15;
  int extraout_EDX;
  int extraout_EDX_00;
  uint uVar16;
  bool bVar17;
  uint uVar18;
  error_category *peVar19;
  fd_set *in_R8;
  timeval *in_R9;
  _Base_ptr p_Var20;
  pollfd *__exceptfds;
  iterator evptr;
  pthread_mutex_t *ppVar21;
  select_interrupter *psVar22;
  ptime pVar23;
  error_code eVar24;
  completion_handler exec;
  error_code select_error;
  lock_guard l;
  undefined1 local_b8 [12];
  undefined4 uStack_ac;
  error_category *peStack_a8;
  size_t local_a0;
  _func_void_completion_handler_ptr *local_98;
  long local_90;
  pthread_mutex_t *local_88;
  error_category *local_80;
  select_interrupter *local_78;
  deque<booster::aio::event_loop_impl::completion_handler,_std::allocator<booster::aio::event_loop_impl::completion_handler>_>
  *local_70;
  undefined1 local_68 [48];
  undefined1 local_38;
  
  local_88 = (pthread_mutex_t *)&this->data_mutex_;
  local_38 = 0;
  this_01 = evs;
  local_68._40_8_ = local_88;
  std::unique_lock<std::recursive_mutex>::lock
            ((unique_lock<std::recursive_mutex> *)(local_68 + 0x28));
  local_38 = 1;
  iVar7 = extraout_EDX;
  if ((this->reactor_)._M_t.
      super___uniq_ptr_impl<booster::aio::reactor,_std::default_delete<booster::aio::reactor>_>._M_t
      .super__Tuple_impl<0UL,_booster::aio::reactor_*,_std::default_delete<booster::aio::reactor>_>.
      super__Head_base<0UL,_booster::aio::reactor_*,_false>._M_head_impl == (reactor *)0x0) {
    this_01 = (event *)operator_new(8);
    reactor::reactor((reactor *)this_01,this->reactor_type_);
    std::__uniq_ptr_impl<booster::aio::reactor,_std::default_delete<booster::aio::reactor>_>::reset
              ((__uniq_ptr_impl<booster::aio::reactor,_std::default_delete<booster::aio::reactor>_>
                *)this,(pointer)this_01);
    iVar7 = extraout_EDX_00;
  }
  psVar22 = &this->interrupter_;
  iVar7 = impl::select_interrupter::open(psVar22,(char *)this_01,iVar7);
  if ((char)iVar7 != '\0') {
    this_00._M_head_impl =
         (this->reactor_)._M_t.
         super___uniq_ptr_impl<booster::aio::reactor,_std::default_delete<booster::aio::reactor>_>.
         _M_t.
         super__Tuple_impl<0UL,_booster::aio::reactor_*,_std::default_delete<booster::aio::reactor>_>
         .super__Head_base<0UL,_booster::aio::reactor_*,_false>._M_head_impl;
    nVar8 = impl::select_interrupter::get_fd(psVar22);
    reactor::select(this_00._M_head_impl,nVar8,(fd_set *)0x1,in_RCX,in_R8,in_R9);
  }
  local_70 = &this->dispatch_queue_;
  local_68._24_8_ = evs_size;
  local_68._32_8_ = evs;
  if (this->stop_ == false) {
    ppcVar1 = (this->dispatch_queue_).
              super__Deque_base<booster::aio::event_loop_impl::completion_handler,_std::allocator<booster::aio::event_loop_impl::completion_handler>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_node;
    iVar7 = (int)((ulong)((long)(this->dispatch_queue_).
                                super__Deque_base<booster::aio::event_loop_impl::completion_handler,_std::allocator<booster::aio::event_loop_impl::completion_handler>_>
                                ._M_impl.super__Deque_impl_data._M_start._M_last -
                         (long)(this->dispatch_queue_).
                               super__Deque_base<booster::aio::event_loop_impl::completion_handler,_std::allocator<booster::aio::event_loop_impl::completion_handler>_>
                               ._M_impl.super__Deque_impl_data._M_start._M_cur) >> 3) * -0x33333333
            + (int)((ulong)((long)(this->dispatch_queue_).
                                  super__Deque_base<booster::aio::event_loop_impl::completion_handler,_std::allocator<booster::aio::event_loop_impl::completion_handler>_>
                                  ._M_impl.super__Deque_impl_data._M_finish._M_cur -
                           (long)(this->dispatch_queue_).
                                 super__Deque_base<booster::aio::event_loop_impl::completion_handler,_std::allocator<booster::aio::event_loop_impl::completion_handler>_>
                                 ._M_impl.super__Deque_impl_data._M_finish._M_first) >> 3) *
              -0x33333333 +
              ((int)((ulong)((long)ppcVar1 -
                            (long)(this->dispatch_queue_).
                                  super__Deque_base<booster::aio::event_loop_impl::completion_handler,_std::allocator<booster::aio::event_loop_impl::completion_handler>_>
                                  ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) + -1 +
              (uint)(ppcVar1 == (_Map_pointer)0x0)) * 0xc;
    do {
      pcVar2 = (this->dispatch_queue_).
               super__Deque_base<booster::aio::event_loop_impl::completion_handler,_std::allocator<booster::aio::event_loop_impl::completion_handler>_>
               ._M_impl.super__Deque_impl_data._M_start._M_cur;
      if (((this->dispatch_queue_).
           super__Deque_base<booster::aio::event_loop_impl::completion_handler,_std::allocator<booster::aio::event_loop_impl::completion_handler>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur == pcVar2) || (iVar7 < 1)) break;
      local_b8._0_8_ = (refcounted *)0x0;
      stack0xffffffffffffff50 =
           (error_category *)((ulong)stack0xffffffffffffff50 & 0xffffffff00000000);
      local_68._8_8_ = std::_V2::system_category();
      local_b8._0_8_ = (pcVar2->h).p_;
      (pcVar2->h).p_ = (refcounted *)0x0;
      local_68._0_8_ = stack0xffffffffffffff50;
      peVar5 = *(error_category **)&pcVar2->e;
      peStack_a8 = (pcVar2->e)._M_cat;
      *(error_category **)&pcVar2->e = stack0xffffffffffffff50;
      (pcVar2->e)._M_cat = (error_category *)local_68._8_8_;
      local_a0 = pcVar2->n;
      pcVar2->n = 0;
      local_98 = pcVar2->type;
      pcVar2->type = completion_handler::op_none;
      unique0x10000ff3 = peVar5;
      std::
      deque<booster::aio::event_loop_impl::completion_handler,_std::allocator<booster::aio::event_loop_impl::completion_handler>_>
      ::pop_front(local_70);
      ppVar21 = local_88;
      pthread_mutex_unlock(local_88);
      (*local_98)((completion_handler *)local_b8);
      iVar9 = pthread_mutex_lock(ppVar21);
      if (iVar9 != 0) {
        std::__throw_system_error(iVar9);
      }
      iVar7 = iVar7 + -1;
      intrusive_ptr<booster::refcounted>::~intrusive_ptr
                ((intrusive_ptr<booster::refcounted> *)local_b8);
    } while (this->stop_ == false);
  }
  pVar23 = ptime::now();
  local_90 = pVar23.sec;
  local_80 = (error_category *)CONCAT44(local_80._4_4_,pVar23.nsec);
  if (this->stop_ == false) {
    local_78 = psVar22;
    do {
      sVar12 = (this->timer_events_)._M_t._M_impl.super__Rb_tree_header._M_node_count;
      if (sVar12 == 0) {
LAB_00161912:
        p_Var20 = ptime::zero;
        iVar7 = DAT_001d58f8;
        if ((this->dispatch_queue_).
            super__Deque_base<booster::aio::event_loop_impl::completion_handler,_std::allocator<booster::aio::event_loop_impl::completion_handler>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            (this->dispatch_queue_).
            super__Deque_base<booster::aio::event_loop_impl::completion_handler,_std::allocator<booster::aio::event_loop_impl::completion_handler>_>
            ._M_impl.super__Deque_impl_data._M_start._M_cur) {
          local_b8._0_8_ = (_Base_ptr)0xe10;
          stack0xffffffffffffff50 =
               (error_category *)((ulong)stack0xffffffffffffff50 & 0xffffffff00000000);
          ptime::normalize((ptime *)local_b8);
          sVar12 = (this->timer_events_)._M_t._M_impl.super__Rb_tree_header._M_node_count;
          p_Var20 = (_Base_ptr)local_b8._0_8_;
          iVar7 = local_b8._8_4_;
        }
        psVar22 = local_78;
        if (sVar12 != 0) {
          p_Var3 = (this->timer_events_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          local_b8._0_8_ = *(long *)(p_Var3 + 1) - local_90;
          stack0xffffffffffffff50 =
               (error_category *)CONCAT44(uStack_ac,*(int *)&p_Var3[1]._M_parent - (int)local_80);
          ptime::normalize((ptime *)local_b8);
          if (((long)local_b8._0_8_ < (long)p_Var20) ||
             ((int)local_b8._8_4_ < iVar7 && (long)local_b8._0_8_ <= (long)p_Var20)) {
            p_Var20 = (_Base_ptr)local_b8._0_8_;
            iVar7 = local_b8._8_4_;
          }
        }
        local_b8._0_8_ = local_b8._0_8_ & 0xffffffff00000000;
        register0x00000000 = (error_category *)std::_V2::system_category();
        ppVar21 = local_88;
        this->polling_ = true;
        local_80 = register0x00000000;
        pthread_mutex_unlock(local_88);
        __exceptfds = (pollfd *)local_68._32_8_;
        uVar11 = (uint)local_68._24_8_;
        uVar10 = reactor::poll((this->reactor_)._M_t.
                               super___uniq_ptr_impl<booster::aio::reactor,_std::default_delete<booster::aio::reactor>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_booster::aio::reactor_*,_std::default_delete<booster::aio::reactor>_>
                               .super__Head_base<0UL,_booster::aio::reactor_*,_false>._M_head_impl,
                               (pollfd *)local_68._32_8_,local_68._24_8_ & 0xffffffff,
                               (int)p_Var20 * 1000 + iVar7 / 1000000);
        iVar7 = pthread_mutex_lock(ppVar21);
        if (iVar7 != 0) {
          std::__throw_system_error(iVar7);
        }
        this->polling_ = false;
        if (((local_b8._0_8_ & 0xfffffffb) != 0) &&
           ((this->dispatch_queue_).
            super__Deque_base<booster::aio::event_loop_impl::completion_handler,_std::allocator<booster::aio::event_loop_impl::completion_handler>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            (this->dispatch_queue_).
            super__Deque_base<booster::aio::event_loop_impl::completion_handler,_std::allocator<booster::aio::event_loop_impl::completion_handler>_>
            ._M_impl.super__Deque_impl_data._M_start._M_cur)) {
          this_02 = (system_error *)__cxa_allocate_exception(0x40);
          eVar24._0_8_ = local_b8._0_8_ & 0xffffffff;
          eVar24._M_cat = stack0xffffffffffffff50;
          system::system_error::system_error(this_02,eVar24);
          __cxa_throw(this_02,&system::system_error::typeinfo,system::system_error::~system_error);
        }
        if ((int)uVar10 < (int)uVar11) {
          uVar11 = uVar10;
        }
        ppVar21 = (pthread_mutex_t *)(ulong)uVar11;
        ppVar13 = __exceptfds;
        ppVar15 = ppVar21;
        if (1 < (int)uVar11) {
          do {
            uVar10 = this->seed_ * 0x41c64e6d + 0x3039;
            this->seed_ = uVar10;
            uVar10 = (uVar10 >> 0x10 & 0x7fff) * (int)ppVar15 >> 0xf;
            pVar4 = *ppVar13;
            *ppVar13 = ppVar13[uVar10];
            ppVar13[uVar10] = pVar4;
            ppVar15 = (pthread_mutex_t *)((long)ppVar15 + -1);
            ppVar13 = ppVar13 + 1;
          } while (ppVar15 != (pthread_mutex_t *)0x0);
        }
        if (0 < (int)uVar11) {
          local_68._24_8_ = &this->map_;
          ppVar15 = (pthread_mutex_t *)0x0;
          local_88 = ppVar21;
          do {
            iVar7 = __exceptfds[(long)ppVar15].fd;
            nVar8 = impl::select_interrupter::get_fd(psVar22);
            if (iVar7 == nVar8) {
              impl::select_interrupter::clean(psVar22);
            }
            else {
              piVar14 = socket_map<booster::aio::event_loop_impl::io_data>::operator[]
                                  ((socket_map<booster::aio::event_loop_impl::io_data> *)
                                   local_68._24_8_,__exceptfds[(long)ppVar15].fd);
              peVar6 = local_80;
              peVar5 = aio_error_cat;
              uVar11 = *(uint *)&__exceptfds[(long)ppVar15].events;
              uVar10 = 0;
              uVar16 = uVar11 & 4;
              if (uVar16 == 0) {
                uVar10 = piVar14->current_event;
              }
              uVar18 = uVar10 & 0xfffffffe;
              if ((uVar11 & 1) == 0) {
                uVar18 = uVar10;
              }
              uVar10 = uVar18 & 0xfffffffd;
              if ((uVar11 & 2) == 0) {
                uVar10 = uVar18;
              }
              local_68._0_8_ = local_68._0_8_ & 0xffffffff00000000;
              local_68._8_8_ = local_80;
              reactor::select((this->reactor_)._M_t.
                              super___uniq_ptr_impl<booster::aio::reactor,_std::default_delete<booster::aio::reactor>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_booster::aio::reactor_*,_std::default_delete<booster::aio::reactor>_>
                              .super__Head_base<0UL,_booster::aio::reactor_*,_false>._M_head_impl,
                              __exceptfds[(long)ppVar15].fd,(fd_set *)(ulong)uVar10,
                              (fd_set *)local_68,(fd_set *)__exceptfds,in_R9);
              uVar11 = uVar16 >> 1;
              peVar19 = peVar5;
              if (uVar16 == 0) {
                peVar19 = peVar6;
              }
              if (local_68._0_4_ != 0) {
                uVar10 = 0;
                peVar19 = peVar5;
                if (uVar16 == 0) {
                  local_90 = CONCAT44(local_90._4_4_,local_68._4_4_);
                  peVar19 = (error_category *)local_68._8_8_;
                  uVar11 = local_68._0_4_;
                  uVar10 = 0;
                }
              }
              piVar14->current_event = uVar10;
              if (((uVar10 & 1) == 0) &&
                 (p_Var20 = (_Base_ptr)(piVar14->readable).call_ptr.p_, p_Var20 != (_Base_ptr)0x0))
              {
                (piVar14->readable).call_ptr.p_ = (callable<void_(const_std::error_code_&)> *)0x0;
                stack0xffffffffffffff50 = (error_category *)CONCAT44((undefined4)local_90,uVar11);
                local_a0 = 0;
                local_98 = completion_handler::op_event_handler;
                local_b8._0_8_ = p_Var20;
                peStack_a8 = peVar19;
                std::
                deque<booster::aio::event_loop_impl::completion_handler,_std::allocator<booster::aio::event_loop_impl::completion_handler>_>
                ::emplace_back<booster::aio::event_loop_impl::completion_handler>
                          (local_70,(completion_handler *)local_b8);
                intrusive_ptr<booster::refcounted>::~intrusive_ptr
                          ((intrusive_ptr<booster::refcounted> *)local_b8);
              }
              ppVar21 = local_88;
              __exceptfds = (pollfd *)local_68._32_8_;
              psVar22 = local_78;
              if (((uVar10 & 2) == 0) &&
                 (p_Var20 = (_Base_ptr)(piVar14->writeable).call_ptr.p_, p_Var20 != (_Base_ptr)0x0))
              {
                (piVar14->writeable).call_ptr.p_ = (callable<void_(const_std::error_code_&)> *)0x0;
                stack0xffffffffffffff50 = (error_category *)CONCAT44((undefined4)local_90,uVar11);
                local_a0 = 0;
                local_98 = completion_handler::op_event_handler;
                local_b8._0_8_ = p_Var20;
                peStack_a8 = peVar19;
                std::
                deque<booster::aio::event_loop_impl::completion_handler,_std::allocator<booster::aio::event_loop_impl::completion_handler>_>
                ::emplace_back<booster::aio::event_loop_impl::completion_handler>
                          (local_70,(completion_handler *)local_b8);
                intrusive_ptr<booster::refcounted>::~intrusive_ptr
                          ((intrusive_ptr<booster::refcounted> *)local_b8);
                __exceptfds = (pollfd *)local_68._32_8_;
                psVar22 = local_78;
              }
            }
            ppVar15 = (pthread_mutex_t *)((long)&(ppVar15->__data).__lock + 1);
          } while (ppVar21 != ppVar15);
        }
        bVar17 = true;
        if (this->stop_ != false) {
          impl::select_interrupter::notify(local_78);
        }
        goto LAB_00161c7f;
      }
      __position._M_node =
           (this->timer_events_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      if ((local_90 < *(long *)(__position._M_node + 1)) ||
         ((local_90 <= *(long *)(__position._M_node + 1) &&
          ((int)local_80 < *(int *)&__position._M_node[1]._M_parent)))) goto LAB_00161912;
      (this->timer_events_index_).
      super__Vector_base<std::_Rb_tree_iterator<std::pair<const_booster::ptime,_booster::aio::event_loop_impl::timer_event>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_booster::ptime,_booster::aio::event_loop_impl::timer_event>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start[*(int *)&__position._M_node[1]._M_left]._M_node =
           &(this->timer_events_)._M_t._M_impl.super__Rb_tree_header._M_header;
      peStack_a8 = (error_category *)std::_V2::system_category();
      local_b8._0_8_ = __position._M_node[1]._M_right;
      __position._M_node[1]._M_right = (_Base_ptr)0x0;
      stack0xffffffffffffff50 =
           (error_category *)((ulong)stack0xffffffffffffff50 & 0xffffffff00000000);
      local_a0 = 0;
      local_98 = completion_handler::op_event_handler;
      std::
      deque<booster::aio::event_loop_impl::completion_handler,_std::allocator<booster::aio::event_loop_impl::completion_handler>_>
      ::push_back(local_70,(value_type *)local_b8);
      std::
      _Rb_tree<booster::ptime,_std::pair<const_booster::ptime,_booster::aio::event_loop_impl::timer_event>,_std::_Select1st<std::pair<const_booster::ptime,_booster::aio::event_loop_impl::timer_event>_>,_std::less<booster::ptime>,_std::allocator<std::pair<const_booster::ptime,_booster::aio::event_loop_impl::timer_event>_>_>
      ::_M_erase_aux(&(this->timer_events_)._M_t,__position);
      intrusive_ptr<booster::refcounted>::~intrusive_ptr
                ((intrusive_ptr<booster::refcounted> *)local_b8);
    } while (this->stop_ == false);
  }
  bVar17 = false;
LAB_00161c7f:
  std::unique_lock<std::recursive_mutex>::~unique_lock
            ((unique_lock<std::recursive_mutex> *)(local_68 + 0x28));
  return bVar17;
}

Assistant:

bool run_one(reactor::event *evs,size_t evs_size)
	{
		lock_guard l(data_mutex_);
		if(!reactor_.get()) {
			reactor_.reset(new reactor(reactor_type_));
		}
		if(interrupter_.open()) {
			reactor_->select(interrupter_.get_fd(),reactor::in);
		}

		int counter = dispatch_queue_.size();
		while(!stop_ && !dispatch_queue_.empty() && counter > 0) {
			completion_handler exec;
			exec.swap(dispatch_queue_.front());
			dispatch_queue_.pop_front();
			
			data_mutex_.unlock();
			try {
				
				exec();
			}
			catch(...) {
				data_mutex_.lock();
				throw;
			}
			data_mutex_.lock();
			counter --;
		}

		ptime now = ptime::now();

		while(!stop_ && !timer_events_.empty() && timer_events_.begin()->first <= now) {
			timer_events_type::iterator evptr = timer_events_.begin();
			timer_events_index_[evptr->second.event_id] = timer_events_.end();
			completion_handler disp(evptr->second.h,system::error_code());
			dispatch_queue_.push_back(disp);
			timer_events_.erase(evptr);
		}


		//
		// Restart -- dispatch timed-out timers, we also need to read now - once again
		//

		if(stop_)
			return false;

		ptime wait_time = dispatch_queue_.empty() ? ptime::hours(1) : ptime::zero;

		if(!timer_events_.empty()) {
			ptime diff = timer_events_.begin()->first - now;
			if(diff < wait_time)
				wait_time = diff;
			assert(wait_time >= ptime::zero);
		}

		
		int n = 0;

		{
			system::error_code poll_error;
			polling_ = true;
			try {
				data_mutex_.unlock();
				n = reactor_->poll(evs,evs_size,int(ptime::milliseconds(wait_time)),poll_error);
			}
			catch(...) {
				data_mutex_.lock();
				polling_ = false;
				throw;
			}
			data_mutex_.lock();
			polling_ = false;
		
			//
			// We may get EBADF, so if we do not handle it we may loop
			// forever. However, maybe there is a handler that handles this
			// in dipatch queue (for example close was executed).
			// So let's try again
			//
			// But if it empty - no handlers, abort.
			//
			if(poll_error && poll_error.value()!=EINTR && dispatch_queue_.empty()) {
				throw system::system_error(poll_error);
			}

		}

		if( n > int(evs_size) )
			n=evs_size;
		randomize_events(evs,n);
		for(int i=0;i<n && i<int(evs_size);i++) {
			
			if(evs[i].fd == interrupter_.get_fd()) {
				interrupter_.clean();
				continue;
			}
			
			using booster::system::error_code;

			io_data &cont = map_[evs[i].fd];
			
			int new_events = cont.current_event;

			error_code dispatch_error;

			if(evs[i].events & reactor::err) {
				dispatch_error = error_code(aio_error::select_failed,aio_error_cat);
				new_events = 0;
			}
			if(evs[i].events & reactor::in)
				new_events &= ~reactor::in;
			if(evs[i].events & reactor::out)
				new_events &= ~reactor::out;
			
			error_code select_error;
			reactor_->select(evs[i].fd,new_events,select_error);
			if(select_error) {
				new_events = 0;
				if(!dispatch_error)
					dispatch_error=select_error;
			}
			
			cont.current_event = new_events;

			if(cont.readable && (new_events & reactor::in) == 0) {
				dispatch_queue_.push_back(completion_handler(cont.readable,dispatch_error));
			}
			if(cont.writeable && (new_events & reactor::out) == 0) {
				dispatch_queue_.push_back(completion_handler(cont.writeable,dispatch_error));
			}
			
			if(new_events == 0)
				map_.erase(evs[i].fd);
		}

		if(stop_) {
			wake();
		}

		return true;

	}